

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryFileLockController::GetTransactionLock
          (CSharedMemoryFileLockController *this,CPalThread *pThread,
          FileTransactionLockType eLockType,DWORD dwOffsetLow,DWORD dwOffsetHigh,
          DWORD nNumberOfBytesToLockLow,DWORD nNumberOfBytesToLockHigh,
          IFileTransactionLock **ppTransactionLock)

{
  UINT64 lockRgnStart_00;
  UINT64 nbBytesToLock_00;
  CSharedMemoryFileTransactionLock *pCVar1;
  UINT64 nbBytesToLock;
  UINT64 lockRgnStart;
  PAL_ERROR palError;
  DWORD nNumberOfBytesToLockLow_local;
  DWORD dwOffsetHigh_local;
  DWORD dwOffsetLow_local;
  FileTransactionLockType eLockType_local;
  CPalThread *pThread_local;
  CSharedMemoryFileLockController *this_local;
  
  lockRgnStart_00 = CONCAT44(dwOffsetHigh,dwOffsetLow);
  nbBytesToLock_00 = CONCAT44(nNumberOfBytesToLockHigh,nNumberOfBytesToLockLow);
  lockRgnStart._4_4_ =
       FILELockFileRegion(this->m_shmFileLocks,this,lockRgnStart_00,nbBytesToLock_00,RDWR_LOCK_RGN);
  if (lockRgnStart._4_4_ == 0) {
    pCVar1 = InternalNew<CorUnix::CSharedMemoryFileTransactionLock,unsigned_long,void*,unsigned_long,unsigned_long>
                       (this->m_shmFileLocks,this,lockRgnStart_00,nbBytesToLock_00);
    *ppTransactionLock = &pCVar1->super_IFileTransactionLock;
    if (*ppTransactionLock == (IFileTransactionLock *)0x0) {
      lockRgnStart._4_4_ = 0xe;
      FILEUnlockFileRegion(this->m_shmFileLocks,this,lockRgnStart_00,nbBytesToLock_00,RDWR_LOCK_RGN)
      ;
    }
  }
  return lockRgnStart._4_4_;
}

Assistant:

PAL_ERROR
CSharedMemoryFileLockController::GetTransactionLock(
    CPalThread *pThread,                // IN, OPTIONAL
    FileTransactionLockType eLockType,
    DWORD dwOffsetLow,
    DWORD dwOffsetHigh,
    DWORD nNumberOfBytesToLockLow,
    DWORD nNumberOfBytesToLockHigh,
    IFileTransactionLock **ppTransactionLock    // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    UINT64 lockRgnStart;
    UINT64 nbBytesToLock;

    lockRgnStart  = ((UINT64)dwOffsetHigh) << 32  | dwOffsetLow;
    nbBytesToLock = ((UINT64)nNumberOfBytesToLockHigh) << 32  | 
                             nNumberOfBytesToLockLow;

    palError = FILELockFileRegion(
        m_shmFileLocks,
        reinterpret_cast<PVOID>(this),
        lockRgnStart, 
        nbBytesToLock,
        RDWR_LOCK_RGN
        );

    if (NO_ERROR == palError)
    {
        *ppTransactionLock = InternalNew<CSharedMemoryFileTransactionLock>(m_shmFileLocks,
                                                                           reinterpret_cast<PVOID>(this),
                                                                           lockRgnStart, 
                                                                           nbBytesToLock);
        if (NULL == *ppTransactionLock)
        {
            palError = ERROR_OUTOFMEMORY;
            FILEUnlockFileRegion(
                m_shmFileLocks,
                reinterpret_cast<PVOID>(this),
                lockRgnStart, 
                nbBytesToLock,
                RDWR_LOCK_RGN
                );
        }
    }

    return palError;
}